

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::anon_unknown_0::
CommandLineInterfaceTest_Plugin_TransitiveDeprecatedFeature_Test::TestBody
          (CommandLineInterfaceTest_Plugin_TransitiveDeprecatedFeature_Test *this)

{
  Descriptor *pDVar1;
  FileDescriptor *pFVar2;
  allocator<char> local_101;
  string local_100;
  string_view local_e0;
  string_view local_d0;
  string_view local_c0;
  string_view local_b0;
  string local_a0;
  string_view local_80;
  string_view local_70 [2];
  string local_50;
  string_view local_30;
  string_view local_20;
  CommandLineInterfaceTest_Plugin_TransitiveDeprecatedFeature_Test *local_10;
  CommandLineInterfaceTest_Plugin_TransitiveDeprecatedFeature_Test *this_local;
  
  local_10 = this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_20,"google/protobuf/descriptor.proto");
  pDVar1 = DescriptorProto::descriptor();
  pFVar2 = Descriptor::file(pDVar1);
  FileDescriptor::DebugString_abi_cxx11_(&local_50,pFVar2);
  local_30 = (string_view)
             std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_50);
  CommandLineInterfaceTester::CreateTempFile((CommandLineInterfaceTester *)this,local_20,local_30);
  std::__cxx11::string::~string((string *)&local_50);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (local_70,"google/protobuf/unittest_features.proto");
  pDVar1 = pb::TestFeatures::descriptor();
  pFVar2 = Descriptor::file(pDVar1);
  FileDescriptor::DebugString_abi_cxx11_(&local_a0,pFVar2);
  local_80 = (string_view)
             std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_a0);
  CommandLineInterfaceTester::CreateTempFile
            ((CommandLineInterfaceTester *)this,local_70[0],local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_b0,"unused.proto")
  ;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_c0,
             "\n    edition = \"2023\";\n    import \"google/protobuf/unittest_features.proto\";\n    package foo;\n    option features.(pb.test).removed_feature = VALUE9;\n    message Foo {}\n  "
            );
  CommandLineInterfaceTester::CreateTempFile((CommandLineInterfaceTester *)this,local_b0,local_c0);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_d0,"foo.proto");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_e0,
             "\n    edition = \"2023\";\n    import \"unused.proto\";\n    package foo;\n    message Bar {\n      Foo foo = 1;\n    }\n  "
            );
  CommandLineInterfaceTester::CreateTempFile((CommandLineInterfaceTester *)this,local_d0,local_e0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_100,
             "protocol_compiler --test_out=$tmpdir --proto_path=$tmpdir foo.proto",&local_101);
  CommandLineInterfaceTest::Run(&this->super_CommandLineInterfaceTest,&local_100);
  std::__cxx11::string::~string((string *)&local_100);
  std::allocator<char>::~allocator(&local_101);
  CommandLineInterfaceTester::ExpectNoErrors((CommandLineInterfaceTester *)this);
  return;
}

Assistant:

TEST_F(CommandLineInterfaceTest, Plugin_TransitiveDeprecatedFeature) {
  CreateTempFile("google/protobuf/descriptor.proto",
                 google::protobuf::DescriptorProto::descriptor()->file()->DebugString());
  CreateTempFile("google/protobuf/unittest_features.proto",
                 pb::TestFeatures::descriptor()->file()->DebugString());
  CreateTempFile("unused.proto",
                 R"schema(
    edition = "2023";
    import "google/protobuf/unittest_features.proto";
    package foo;
    option features.(pb.test).removed_feature = VALUE9;
    message Foo {}
  )schema");
  CreateTempFile("foo.proto",
                 R"schema(
    edition = "2023";
    import "unused.proto";
    package foo;
    message Bar {
      Foo foo = 1;
    }
  )schema");

  Run("protocol_compiler --test_out=$tmpdir "
      "--proto_path=$tmpdir foo.proto");
  ExpectNoErrors();
}